

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::Finalize(SQVM *this)

{
  SQUnsignedInteger SVar1;
  SQUnsignedInteger SVar2;
  bool bVar3;
  CallInfo local_68;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals);
  }
  SQObjectPtr::Null(&this->_roottable);
  SQObjectPtr::Null(&this->_lasterror);
  SQObjectPtr::Null(&this->_errorhandler);
  this->_debughook = false;
  this->_debughook_native = (SQDEBUGHOOK)0x0;
  SQObjectPtr::Null(&this->_debughook_closure);
  SQObjectPtr::Null(&this->temp_reg);
  local_68._closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_68._prevtop = 0;
  local_68._target = 0;
  local_68._ncalls = 0;
  local_68._60_4_ = 0;
  local_68._generator = (SQGenerator *)0x0;
  local_68._etraps = 0;
  local_68._prevstkbase = 0;
  local_68._ip = (SQInstruction *)0x0;
  local_68._literals = (SQObjectPtr *)0x0;
  local_68._root = 0;
  local_68._closure.super_SQObject._type = OT_NULL;
  local_68._closure.super_SQObject._4_4_ = 0;
  sqvector<SQVM::CallInfo>::resize(&this->_callstackdata,0,&local_68);
  SQObjectPtr::~SQObjectPtr(&local_68._closure);
  SVar1 = (this->_stack)._size;
  SVar2 = 0;
  if ((long)SVar1 < 1) {
    SVar1 = SVar2;
  }
  while (bVar3 = SVar1 != 0, SVar1 = SVar1 - 1, bVar3) {
    SQObjectPtr::Null((SQObjectPtr *)((long)&(((this->_stack)._vals)->super_SQObject)._type + SVar2)
                     );
    SVar2 = SVar2 + 0x10;
  }
  return;
}

Assistant:

void SQVM::Finalize()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    if(_openouters) CloseOuters(&_stack._vals[0]);
    _roottable.Null();
    _lasterror.Null();
    _errorhandler.Null();
    _debughook = false;
    _debughook_native = NULL;
    _debughook_closure.Null();
    temp_reg.Null();
    _callstackdata.resize(0);
    SQInteger size=_stack.size();
    for(SQInteger i=0;i<size;i++)
        _stack[i].Null();
}